

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialized_message.h
# Opt level: O2

SerializedMessage * __thiscall
miniros::SerializedMessage::operator=(SerializedMessage *this,SerializedMessage *param_1)

{
  uint8_t *puVar1;
  
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)param_1);
  puVar1 = param_1->message_start;
  this->num_bytes = param_1->num_bytes;
  this->message_start = puVar1;
  std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>);
  this->type_info = param_1->type_info;
  return this;
}

Assistant:

class MINIROS_DECL SerializedMessage
{
public:
  using shared_array_uint8_t = std::shared_ptr<uint8_t[]>;
  shared_array_uint8_t buf;
  size_t num_bytes;
  uint8_t* message_start;

  std::shared_ptr<void const> message;
  const std::type_info* type_info;

  SerializedMessage()
  : buf(shared_array_uint8_t())
  , num_bytes(0)
  , message_start(0)
  , type_info(0)
  {}

  SerializedMessage(shared_array_uint8_t buf, size_t num_bytes)
  : buf(buf)
  , num_bytes(num_bytes)
  , message_start(buf ? buf.get() : 0)
  , type_info(0)
  { }
}